

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bignum.cc
# Opt level: O1

void TestMultiplyUInt64(void)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  undefined8 uVar4;
  char *pcVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  Vector<const_char> value;
  Vector<const_char> value_00;
  Vector<const_char> value_01;
  Vector<const_char> value_02;
  Vector<const_char> value_03;
  Vector<const_char> value_04;
  Vector<const_char> value_05;
  Vector<const_char> value_06;
  Vector<const_char> value_07;
  Vector<const_char> value_08;
  Vector<const_char> value_09;
  Vector<const_char> value_10;
  char buffer [1024];
  Bignum bignum;
  char local_618;
  char cStack_617;
  char cStack_616;
  char cStack_615;
  char cStack_614;
  char cStack_613;
  char cStack_612;
  char cStack_611;
  char cStack_610;
  char cStack_60f;
  char cStack_60e;
  char cStack_60d;
  char cStack_60c;
  char cStack_60b;
  char cStack_60a;
  char cStack_609;
  char local_608;
  char cStack_607;
  char cStack_606;
  char cStack_605;
  char cStack_604;
  char cStack_603;
  char cStack_602;
  char cStack_601;
  char cStack_600;
  char cStack_5ff;
  char cStack_5fe;
  char cStack_5fd;
  char cStack_5fc;
  char cStack_5fb;
  char cStack_5fa;
  Bignum local_214;
  
  local_214.used_bigits_ = 0;
  local_214.exponent_ = 0;
  value._8_8_ = 1;
  value.start_ = "0";
  double_conversion::Bignum::AssignHexString(&local_214,value);
  double_conversion::Bignum::MultiplyByUInt64(&local_214,0x25);
  bVar1 = double_conversion::Bignum::ToHexString(&local_214,&local_618,0x400);
  if (!bVar1) {
    uVar4 = 0x22e;
LAB_00821f6a:
    printf("%s:%d:\n CHECK(%s) failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/mmp[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-bignum.cc"
           ,uVar4,"bignum.ToHexString(buffer, kBufferSize)");
    abort();
  }
  if (CONCAT11(cStack_617,local_618) == 0x30) {
    value_00._8_8_ = 1;
    value_00.start_ = "2";
    double_conversion::Bignum::AssignHexString(&local_214,value_00);
    double_conversion::Bignum::MultiplyByUInt64(&local_214,5);
    bVar1 = double_conversion::Bignum::ToHexString(&local_214,&local_618,0x400);
    if (!bVar1) {
      uVar4 = 0x233;
      goto LAB_00821f6a;
    }
    if (CONCAT11(cStack_617,local_618) == 0x41) {
      value_01._8_8_ = 8;
      value_01.start_ = "10000000";
      double_conversion::Bignum::AssignHexString(&local_214,value_01);
      double_conversion::Bignum::MultiplyByUInt64(&local_214,9);
      bVar1 = double_conversion::Bignum::ToHexString(&local_214,&local_618,0x400);
      if (!bVar1) {
        uVar4 = 0x238;
        goto LAB_00821f6a;
      }
      if (cStack_610 == '\0' &&
          CONCAT17(cStack_611,
                   CONCAT16(cStack_612,
                            CONCAT15(cStack_613,
                                     CONCAT14(cStack_614,
                                              CONCAT13(cStack_615,
                                                       CONCAT12(cStack_616,
                                                                CONCAT11(cStack_617,local_618)))))))
          == 0x3030303030303039) {
        value_02._8_8_ = 0xf;
        value_02.start_ = "100000000000000";
        double_conversion::Bignum::AssignHexString(&local_214,value_02);
        double_conversion::Bignum::MultiplyByUInt64(&local_214,0xffff);
        bVar1 = double_conversion::Bignum::ToHexString(&local_214,&local_618,0x400);
        if (!bVar1) {
          uVar4 = 0x23d;
          goto LAB_00821f6a;
        }
        auVar15[0] = -(cStack_615 == 'F');
        auVar15[1] = -(cStack_614 == '0');
        auVar15[2] = -(cStack_613 == '0');
        auVar15[3] = -(cStack_612 == '0');
        auVar15[4] = -(cStack_611 == '0');
        auVar15[5] = -(cStack_610 == '0');
        auVar15[6] = -(cStack_60f == '0');
        auVar15[7] = -(cStack_60e == '0');
        auVar15[8] = -(cStack_60d == '0');
        auVar15[9] = -(cStack_60c == '0');
        auVar15[10] = -(cStack_60b == '0');
        auVar15[0xb] = -(cStack_60a == '0');
        auVar15[0xc] = -(cStack_609 == '0');
        auVar15[0xd] = -(local_608 == '0');
        auVar15[0xe] = -(cStack_607 == '0');
        auVar15[0xf] = -(cStack_606 == '\0');
        auVar6[0] = -(local_618 == 'F');
        auVar6[1] = -(cStack_617 == 'F');
        auVar6[2] = -(cStack_616 == 'F');
        auVar6[3] = -(cStack_615 == 'F');
        auVar6[4] = -(cStack_614 == '0');
        auVar6[5] = -(cStack_613 == '0');
        auVar6[6] = -(cStack_612 == '0');
        auVar6[7] = -(cStack_611 == '0');
        auVar6[8] = -(cStack_610 == '0');
        auVar6[9] = -(cStack_60f == '0');
        auVar6[10] = -(cStack_60e == '0');
        auVar6[0xb] = -(cStack_60d == '0');
        auVar6[0xc] = -(cStack_60c == '0');
        auVar6[0xd] = -(cStack_60b == '0');
        auVar6[0xe] = -(cStack_60a == '0');
        auVar6[0xf] = -(cStack_609 == '0');
        auVar6 = auVar6 & auVar15;
        if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar6[0xf] >> 7) << 0xf) == 0xffff) {
          value_03._8_8_ = 0xf;
          value_03.start_ = "100000000000000";
          double_conversion::Bignum::AssignHexString(&local_214,value_03);
          double_conversion::Bignum::MultiplyByUInt64(&local_214,0xffffffffffffffff);
          bVar1 = double_conversion::Bignum::ToHexString(&local_214,&local_618,0x400);
          if (!bVar1) {
            uVar4 = 0x242;
            goto LAB_00821f6a;
          }
          auVar7[0] = -(local_618 == 'F');
          auVar7[1] = -(cStack_617 == 'F');
          auVar7[2] = -(cStack_616 == 'F');
          auVar7[3] = -(cStack_615 == 'F');
          auVar7[4] = -(cStack_614 == 'F');
          auVar7[5] = -(cStack_613 == 'F');
          auVar7[6] = -(cStack_612 == 'F');
          auVar7[7] = -(cStack_611 == 'F');
          auVar7[8] = -(cStack_610 == 'F');
          auVar7[9] = -(cStack_60f == 'F');
          auVar7[10] = -(cStack_60e == 'F');
          auVar7[0xb] = -(cStack_60d == 'F');
          auVar7[0xc] = -(cStack_60c == 'F');
          auVar7[0xd] = -(cStack_60b == 'F');
          auVar7[0xe] = -(cStack_60a == 'F');
          auVar7[0xf] = -(cStack_609 == 'F');
          auVar22[0] = -(cStack_609 == 'F');
          auVar22[1] = -(local_608 == '0');
          auVar22[2] = -(cStack_607 == '0');
          auVar22[3] = -(cStack_606 == '0');
          auVar22[4] = -(cStack_605 == '0');
          auVar22[5] = -(cStack_604 == '0');
          auVar22[6] = -(cStack_603 == '0');
          auVar22[7] = -(cStack_602 == '0');
          auVar22[8] = -(cStack_601 == '0');
          auVar22[9] = -(cStack_600 == '0');
          auVar22[10] = -(cStack_5ff == '0');
          auVar22[0xb] = -(cStack_5fe == '0');
          auVar22[0xc] = -(cStack_5fd == '0');
          auVar22[0xd] = -(cStack_5fc == '0');
          auVar22[0xe] = -(cStack_5fb == '0');
          auVar22[0xf] = -(cStack_5fa == '\0');
          auVar7 = auVar7 & auVar22;
          if ((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar7[0xf] >> 7) << 0xf) == 0xffff) {
            value_04._8_8_ = 0xb;
            value_04.start_ = "1234567ABCD";
            double_conversion::Bignum::AssignHexString(&local_214,value_04);
            double_conversion::Bignum::MultiplyByUInt64(&local_214,0xfff);
            bVar1 = double_conversion::Bignum::ToHexString(&local_214,&local_618,0x400);
            if (!bVar1) {
              uVar4 = 0x247;
              goto LAB_00821f6a;
            }
            if (CONCAT17(cStack_60a,
                         CONCAT16(cStack_60b,
                                  CONCAT15(cStack_60c,
                                           CONCAT14(cStack_60d,
                                                    CONCAT13(cStack_60e,
                                                             CONCAT12(cStack_60f,
                                                                      CONCAT11(cStack_610,cStack_611
                                                                              ))))))) ==
                0x33333432353535 &&
                CONCAT17(cStack_611,
                         CONCAT16(cStack_612,
                                  CONCAT15(cStack_613,
                                           CONCAT14(cStack_614,
                                                    CONCAT13(cStack_615,
                                                             CONCAT12(cStack_616,
                                                                      CONCAT11(cStack_617,local_618)
                                                                     )))))) == 0x3533333333333231) {
              value_05._8_8_ = 0xb;
              value_05.start_ = "1234567ABCD";
              double_conversion::Bignum::AssignHexString(&local_214,value_05);
              double_conversion::Bignum::MultiplyByUInt64(&local_214,0xffffffffff);
              bVar1 = double_conversion::Bignum::ToHexString(&local_214,&local_618,0x400);
              if (!bVar1) {
                uVar4 = 0x24c;
                goto LAB_00821f6a;
              }
              auVar16[0] = -(cStack_612 == '7');
              auVar16[1] = -(cStack_611 == 'A');
              auVar16[2] = -(cStack_610 == 'B');
              auVar16[3] = -(cStack_60f == 'C');
              auVar16[4] = -(cStack_60e == 'B');
              auVar16[5] = -(cStack_60d == 'D');
              auVar16[6] = -(cStack_60c == 'C');
              auVar16[7] = -(cStack_60b == 'B');
              auVar16[8] = -(cStack_60a == 'A');
              auVar16[9] = -(cStack_609 == '9');
              auVar16[10] = -(local_608 == '8');
              auVar16[0xb] = -(cStack_607 == '5');
              auVar16[0xc] = -(cStack_606 == '4');
              auVar16[0xd] = -(cStack_605 == '3');
              auVar16[0xe] = -(cStack_604 == '3');
              auVar16[0xf] = -(cStack_603 == '\0');
              auVar8[0] = -(local_618 == '1');
              auVar8[1] = -(cStack_617 == '2');
              auVar8[2] = -(cStack_616 == '3');
              auVar8[3] = -(cStack_615 == '4');
              auVar8[4] = -(cStack_614 == '5');
              auVar8[5] = -(cStack_613 == '6');
              auVar8[6] = -(cStack_612 == '7');
              auVar8[7] = -(cStack_611 == 'A');
              auVar8[8] = -(cStack_610 == 'B');
              auVar8[9] = -(cStack_60f == 'C');
              auVar8[10] = -(cStack_60e == 'B');
              auVar8[0xb] = -(cStack_60d == 'D');
              auVar8[0xc] = -(cStack_60c == 'C');
              auVar8[0xd] = -(cStack_60b == 'B');
              auVar8[0xe] = -(cStack_60a == 'A');
              auVar8[0xf] = -(cStack_609 == '9');
              auVar8 = auVar8 & auVar16;
              if ((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar8[0xf] >> 7) << 0xf) == 0xffff) {
                value_06._8_8_ = 0x10;
                value_06.start_ = "FFFFFFFFFFFFFFFF";
                double_conversion::Bignum::AssignHexString(&local_214,value_06);
                double_conversion::Bignum::MultiplyByUInt64(&local_214,2);
                bVar1 = double_conversion::Bignum::ToHexString(&local_214,&local_618,0x400);
                if (!bVar1) {
                  uVar4 = 0x251;
                  goto LAB_00821f6a;
                }
                auVar9[0] = -(local_618 == '1');
                auVar9[1] = -(cStack_617 == 'F');
                auVar9[2] = -(cStack_616 == 'F');
                auVar9[3] = -(cStack_615 == 'F');
                auVar9[4] = -(cStack_614 == 'F');
                auVar9[5] = -(cStack_613 == 'F');
                auVar9[6] = -(cStack_612 == 'F');
                auVar9[7] = -(cStack_611 == 'F');
                auVar9[8] = -(cStack_610 == 'F');
                auVar9[9] = -(cStack_60f == 'F');
                auVar9[10] = -(cStack_60e == 'F');
                auVar9[0xb] = -(cStack_60d == 'F');
                auVar9[0xc] = -(cStack_60c == 'F');
                auVar9[0xd] = -(cStack_60b == 'F');
                auVar9[0xe] = -(cStack_60a == 'F');
                auVar9[0xf] = -(cStack_609 == 'F');
                auVar17[0] = -((char)_local_608 == 'E');
                auVar17[1] = -((char)((ushort)_local_608 >> 8) == '\0');
                auVar17[2] = 0xff;
                auVar17[3] = 0xff;
                auVar17[4] = 0xff;
                auVar17[5] = 0xff;
                auVar17[6] = 0xff;
                auVar17[7] = 0xff;
                auVar17[8] = 0xff;
                auVar17[9] = 0xff;
                auVar17[10] = 0xff;
                auVar17[0xb] = 0xff;
                auVar17[0xc] = 0xff;
                auVar17[0xd] = 0xff;
                auVar17[0xe] = 0xff;
                auVar17[0xf] = 0xff;
                auVar17 = auVar17 & auVar9;
                if ((ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                            (ushort)(byte)(auVar17[0xf] >> 7) << 0xf) == 0xffff) {
                  value_07._8_8_ = 0x10;
                  value_07.start_ = "FFFFFFFFFFFFFFFF";
                  double_conversion::Bignum::AssignHexString(&local_214,value_07);
                  double_conversion::Bignum::MultiplyByUInt64(&local_214,4);
                  bVar1 = double_conversion::Bignum::ToHexString(&local_214,&local_618,0x400);
                  if (!bVar1) {
                    uVar4 = 0x256;
                    goto LAB_00821f6a;
                  }
                  auVar10[0] = -(local_618 == '3');
                  auVar10[1] = -(cStack_617 == 'F');
                  auVar10[2] = -(cStack_616 == 'F');
                  auVar10[3] = -(cStack_615 == 'F');
                  auVar10[4] = -(cStack_614 == 'F');
                  auVar10[5] = -(cStack_613 == 'F');
                  auVar10[6] = -(cStack_612 == 'F');
                  auVar10[7] = -(cStack_611 == 'F');
                  auVar10[8] = -(cStack_610 == 'F');
                  auVar10[9] = -(cStack_60f == 'F');
                  auVar10[10] = -(cStack_60e == 'F');
                  auVar10[0xb] = -(cStack_60d == 'F');
                  auVar10[0xc] = -(cStack_60c == 'F');
                  auVar10[0xd] = -(cStack_60b == 'F');
                  auVar10[0xe] = -(cStack_60a == 'F');
                  auVar10[0xf] = -(cStack_609 == 'F');
                  auVar18[0] = -((char)_local_608 == 'C');
                  auVar18[1] = -((char)((ushort)_local_608 >> 8) == '\0');
                  auVar18[2] = 0xff;
                  auVar18[3] = 0xff;
                  auVar18[4] = 0xff;
                  auVar18[5] = 0xff;
                  auVar18[6] = 0xff;
                  auVar18[7] = 0xff;
                  auVar18[8] = 0xff;
                  auVar18[9] = 0xff;
                  auVar18[10] = 0xff;
                  auVar18[0xb] = 0xff;
                  auVar18[0xc] = 0xff;
                  auVar18[0xd] = 0xff;
                  auVar18[0xe] = 0xff;
                  auVar18[0xf] = 0xff;
                  auVar18 = auVar18 & auVar10;
                  if ((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                               (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                               (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                               (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                               (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                               (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                               (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                               (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                               (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                               (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                               (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                               (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                               (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                               (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                              (ushort)(byte)(auVar18[0xf] >> 7) << 0xf) == 0xffff) {
                    value_08._8_8_ = 0x10;
                    value_08.start_ = "FFFFFFFFFFFFFFFF";
                    double_conversion::Bignum::AssignHexString(&local_214,value_08);
                    double_conversion::Bignum::MultiplyByUInt64(&local_214,0xf);
                    bVar1 = double_conversion::Bignum::ToHexString(&local_214,&local_618,0x400);
                    if (!bVar1) {
                      uVar4 = 0x25b;
                      goto LAB_00821f6a;
                    }
                    auVar11[0] = -(local_618 == 'E');
                    auVar11[1] = -(cStack_617 == 'F');
                    auVar11[2] = -(cStack_616 == 'F');
                    auVar11[3] = -(cStack_615 == 'F');
                    auVar11[4] = -(cStack_614 == 'F');
                    auVar11[5] = -(cStack_613 == 'F');
                    auVar11[6] = -(cStack_612 == 'F');
                    auVar11[7] = -(cStack_611 == 'F');
                    auVar11[8] = -(cStack_610 == 'F');
                    auVar11[9] = -(cStack_60f == 'F');
                    auVar11[10] = -(cStack_60e == 'F');
                    auVar11[0xb] = -(cStack_60d == 'F');
                    auVar11[0xc] = -(cStack_60c == 'F');
                    auVar11[0xd] = -(cStack_60b == 'F');
                    auVar11[0xe] = -(cStack_60a == 'F');
                    auVar11[0xf] = -(cStack_609 == 'F');
                    auVar19[0] = -((char)_local_608 == '1');
                    auVar19[1] = -((char)((ushort)_local_608 >> 8) == '\0');
                    auVar19[2] = 0xff;
                    auVar19[3] = 0xff;
                    auVar19[4] = 0xff;
                    auVar19[5] = 0xff;
                    auVar19[6] = 0xff;
                    auVar19[7] = 0xff;
                    auVar19[8] = 0xff;
                    auVar19[9] = 0xff;
                    auVar19[10] = 0xff;
                    auVar19[0xb] = 0xff;
                    auVar19[0xc] = 0xff;
                    auVar19[0xd] = 0xff;
                    auVar19[0xe] = 0xff;
                    auVar19[0xf] = 0xff;
                    auVar19 = auVar19 & auVar11;
                    if ((ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
                                (ushort)(byte)(auVar19[0xf] >> 7) << 0xf) == 0xffff) {
                      value_09._8_8_ = 0x10;
                      value_09.start_ = "FFFFFFFFFFFFFFFF";
                      double_conversion::Bignum::AssignHexString(&local_214,value_09);
                      double_conversion::Bignum::MultiplyByUInt64(&local_214,0xffffffffffffffff);
                      bVar1 = double_conversion::Bignum::ToHexString(&local_214,&local_618,0x400);
                      if (!bVar1) {
                        uVar4 = 0x260;
                        goto LAB_00821f6a;
                      }
                      iVar2 = bcmp("FFFFFFFFFFFFFFFE0000000000000001",&local_618,0x21);
                      if (iVar2 == 0) {
                        double_conversion::Bignum::AssignUInt16(&local_214,1);
                        double_conversion::Bignum::ShiftLeft(&local_214,100);
                        double_conversion::Bignum::MultiplyByUInt64(&local_214,2);
                        bVar1 = double_conversion::Bignum::ToHexString(&local_214,&local_618,0x400);
                        if (!bVar1) {
                          uVar4 = 0x267;
                          goto LAB_00821f6a;
                        }
                        auVar20[0] = -(cStack_60d == '0');
                        auVar20[1] = -(cStack_60c == '0');
                        auVar20[2] = -(cStack_60b == '0');
                        auVar20[3] = -(cStack_60a == '0');
                        auVar20[4] = -(cStack_609 == '0');
                        auVar20[5] = -(local_608 == '0');
                        auVar20[6] = -(cStack_607 == '0');
                        auVar20[7] = -(cStack_606 == '0');
                        auVar20[8] = -(cStack_605 == '0');
                        auVar20[9] = -(cStack_604 == '0');
                        auVar20[10] = -(cStack_603 == '0');
                        auVar20[0xb] = -(cStack_602 == '0');
                        auVar20[0xc] = -(cStack_601 == '0');
                        auVar20[0xd] = -(cStack_600 == '0');
                        auVar20[0xe] = -(cStack_5ff == '0');
                        auVar20[0xf] = -(cStack_5fe == '\0');
                        auVar12[0] = -(local_618 == '2');
                        auVar12[1] = -(cStack_617 == '0');
                        auVar12[2] = -(cStack_616 == '0');
                        auVar12[3] = -(cStack_615 == '0');
                        auVar12[4] = -(cStack_614 == '0');
                        auVar12[5] = -(cStack_613 == '0');
                        auVar12[6] = -(cStack_612 == '0');
                        auVar12[7] = -(cStack_611 == '0');
                        auVar12[8] = -(cStack_610 == '0');
                        auVar12[9] = -(cStack_60f == '0');
                        auVar12[10] = -(cStack_60e == '0');
                        auVar12[0xb] = -(cStack_60d == '0');
                        auVar12[0xc] = -(cStack_60c == '0');
                        auVar12[0xd] = -(cStack_60b == '0');
                        auVar12[0xe] = -(cStack_60a == '0');
                        auVar12[0xf] = -(cStack_609 == '0');
                        auVar12 = auVar12 & auVar20;
                        if ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                                    (ushort)(byte)(auVar12[0xf] >> 7) << 0xf) == 0xffff) {
                          double_conversion::Bignum::AssignUInt16(&local_214,1);
                          double_conversion::Bignum::ShiftLeft(&local_214,100);
                          double_conversion::Bignum::MultiplyByUInt64(&local_214,0xf);
                          bVar1 = double_conversion::Bignum::ToHexString
                                            (&local_214,&local_618,0x400);
                          if (!bVar1) {
                            uVar4 = 0x26e;
                            goto LAB_00821f6a;
                          }
                          auVar13[0] = -(local_618 == 'F');
                          auVar13[1] = -(cStack_617 == '0');
                          auVar13[2] = -(cStack_616 == '0');
                          auVar13[3] = -(cStack_615 == '0');
                          auVar13[4] = -(cStack_614 == '0');
                          auVar13[5] = -(cStack_613 == '0');
                          auVar13[6] = -(cStack_612 == '0');
                          auVar13[7] = -(cStack_611 == '0');
                          auVar13[8] = -(cStack_610 == '0');
                          auVar13[9] = -(cStack_60f == '0');
                          auVar13[10] = -(cStack_60e == '0');
                          auVar13[0xb] = -(cStack_60d == '0');
                          auVar13[0xc] = -(cStack_60c == '0');
                          auVar13[0xd] = -(cStack_60b == '0');
                          auVar13[0xe] = -(cStack_60a == '0');
                          auVar13[0xf] = -(cStack_609 == '0');
                          auVar23[0] = -(cStack_60d == '0');
                          auVar23[1] = -(cStack_60c == '0');
                          auVar23[2] = -(cStack_60b == '0');
                          auVar23[3] = -(cStack_60a == '0');
                          auVar23[4] = -(cStack_609 == '0');
                          auVar23[5] = -(local_608 == '0');
                          auVar23[6] = -(cStack_607 == '0');
                          auVar23[7] = -(cStack_606 == '0');
                          auVar23[8] = -(cStack_605 == '0');
                          auVar23[9] = -(cStack_604 == '0');
                          auVar23[10] = -(cStack_603 == '0');
                          auVar23[0xb] = -(cStack_602 == '0');
                          auVar23[0xc] = -(cStack_601 == '0');
                          auVar23[0xd] = -(cStack_600 == '0');
                          auVar23[0xe] = -(cStack_5ff == '0');
                          auVar23[0xf] = -(cStack_5fe == '\0');
                          auVar13 = auVar13 & auVar23;
                          if ((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                                       (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                                       (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                                       (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                                       (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                                       (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                                       (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                                       (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                                       (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                                       (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                                       (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                                       (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                                       (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                                       (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                                       (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                                      (ushort)(byte)(auVar13[0xf] >> 7) << 0xf) == 0xffff) {
                            double_conversion::Bignum::AssignUInt16(&local_214,0xffff);
                            double_conversion::Bignum::ShiftLeft(&local_214,100);
                            double_conversion::Bignum::MultiplyByUInt64(&local_214,0xffff);
                            bVar1 = double_conversion::Bignum::ToHexString
                                              (&local_214,&local_618,0x400);
                            if (!bVar1) {
                              uVar4 = 0x275;
                              goto LAB_00821f6a;
                            }
                            iVar2 = bcmp("FFFE00010000000000000000000000000",&local_618,0x22);
                            if (iVar2 == 0) {
                              double_conversion::Bignum::AssignUInt16(&local_214,0xffff);
                              double_conversion::Bignum::ShiftLeft(&local_214,100);
                              double_conversion::Bignum::MultiplyByUInt64(&local_214,0xffffffff);
                              bVar1 = double_conversion::Bignum::ToHexString
                                                (&local_214,&local_618,0x400);
                              if (!bVar1) {
                                uVar4 = 0x27c;
                                goto LAB_00821f6a;
                              }
                              iVar2 = bcmp("FFFEFFFF00010000000000000000000000000",&local_618,0x26);
                              if (iVar2 == 0) {
                                double_conversion::Bignum::AssignUInt16(&local_214,0xffff);
                                double_conversion::Bignum::ShiftLeft(&local_214,100);
                                double_conversion::Bignum::MultiplyByUInt64
                                          (&local_214,0xffffffffffffffff);
                                bVar1 = double_conversion::Bignum::ToHexString
                                                  (&local_214,&local_618,0x400);
                                if (!bVar1) {
                                  uVar4 = 0x283;
                                  goto LAB_00821f6a;
                                }
                                iVar2 = bcmp("FFFEFFFFFFFFFFFF00010000000000000000000000000",
                                             &local_618,0x2e);
                                if (iVar2 == 0) {
                                  value_10._8_8_ = 0x11;
                                  value_10.start_ = "15611230384529777";
                                  double_conversion::Bignum::AssignDecimalString
                                            (&local_214,value_10);
                                  double_conversion::Bignum::MultiplyByUInt64
                                            (&local_214,10000000000000000000);
                                  bVar1 = double_conversion::Bignum::ToHexString
                                                    (&local_214,&local_618,0x400);
                                  if (!bVar1) {
                                    uVar4 = 0x288;
                                    goto LAB_00821f6a;
                                  }
                                  auVar21[0] = -(cStack_609 == 'F');
                                  auVar21[1] = -(local_608 == '3');
                                  auVar21[2] = -(cStack_607 == 'D');
                                  auVar21[3] = -(cStack_606 == 'E');
                                  auVar21[4] = -(cStack_605 == '7');
                                  auVar21[5] = -(cStack_604 == 'F');
                                  auVar21[6] = -(cStack_603 == '3');
                                  auVar21[7] = -(cStack_602 == 'C');
                                  auVar21[8] = -(cStack_601 == '7');
                                  auVar21[9] = -(cStack_600 == '6');
                                  auVar21[10] = -(cStack_5ff == '8');
                                  auVar21[0xb] = -(cStack_5fe == '0');
                                  auVar21[0xc] = -(cStack_5fd == '0');
                                  auVar21[0xd] = -(cStack_5fc == '0');
                                  auVar21[0xe] = -(cStack_5fb == '0');
                                  auVar21[0xf] = -(cStack_5fa == '\0');
                                  auVar14[0] = -(local_618 == '1');
                                  auVar14[1] = -(cStack_617 == 'E');
                                  auVar14[2] = -(cStack_616 == '1');
                                  auVar14[3] = -(cStack_615 == '0');
                                  auVar14[4] = -(cStack_614 == 'E');
                                  auVar14[5] = -(cStack_613 == 'E');
                                  auVar14[6] = -(cStack_612 == '4');
                                  auVar14[7] = -(cStack_611 == 'B');
                                  auVar14[8] = -(cStack_610 == '1');
                                  auVar14[9] = -(cStack_60f == '1');
                                  auVar14[10] = -(cStack_60e == 'D');
                                  auVar14[0xb] = -(cStack_60d == '1');
                                  auVar14[0xc] = -(cStack_60c == '5');
                                  auVar14[0xd] = -(cStack_60b == 'A');
                                  auVar14[0xe] = -(cStack_60a == '7');
                                  auVar14[0xf] = -(cStack_609 == 'F');
                                  auVar14 = auVar14 & auVar21;
                                  if ((ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                                               (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                                               (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                                               (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                                               (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                                               (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                                               (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                                               (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                                               (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                                               (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                                               (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                                               (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                                               (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                                               (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                                               (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                                              (ushort)(byte)(auVar14[0xf] >> 7) << 0xf) == 0xffff) {
                                    return;
                                  }
                                  pcVar3 = "\"1E10EE4B11D15A7F3DE7F3C7680000\"";
                                  pcVar5 = "1E10EE4B11D15A7F3DE7F3C7680000";
                                  uVar4 = 0x289;
                                }
                                else {
                                  pcVar3 = "\"FFFEFFFFFFFFFFFF00010000000000000000000000000\"";
                                  pcVar5 = "FFFEFFFFFFFFFFFF00010000000000000000000000000";
                                  uVar4 = 0x284;
                                }
                              }
                              else {
                                pcVar3 = "\"FFFEFFFF00010000000000000000000000000\"";
                                pcVar5 = "FFFEFFFF00010000000000000000000000000";
                                uVar4 = 0x27d;
                              }
                            }
                            else {
                              pcVar3 = "\"FFFE00010000000000000000000000000\"";
                              pcVar5 = "FFFE00010000000000000000000000000";
                              uVar4 = 0x276;
                            }
                          }
                          else {
                            pcVar3 = "\"F0000000000000000000000000\"";
                            pcVar5 = "F0000000000000000000000000";
                            uVar4 = 0x26f;
                          }
                        }
                        else {
                          pcVar3 = "\"20000000000000000000000000\"";
                          pcVar5 = "20000000000000000000000000";
                          uVar4 = 0x268;
                        }
                      }
                      else {
                        pcVar3 = "\"FFFFFFFFFFFFFFFE0000000000000001\"";
                        pcVar5 = "FFFFFFFFFFFFFFFE0000000000000001";
                        uVar4 = 0x261;
                      }
                    }
                    else {
                      pcVar3 = "\"EFFFFFFFFFFFFFFF1\"";
                      pcVar5 = "EFFFFFFFFFFFFFFF1";
                      uVar4 = 0x25c;
                    }
                  }
                  else {
                    pcVar3 = "\"3FFFFFFFFFFFFFFFC\"";
                    pcVar5 = "3FFFFFFFFFFFFFFFC";
                    uVar4 = 599;
                  }
                }
                else {
                  pcVar3 = "\"1FFFFFFFFFFFFFFFE\"";
                  pcVar5 = "1FFFFFFFFFFFFFFFE";
                  uVar4 = 0x252;
                }
              }
              else {
                pcVar3 = "\"1234567ABCBDCBA985433\"";
                pcVar5 = "1234567ABCBDCBA985433";
                uVar4 = 0x24d;
              }
            }
            else {
              pcVar3 = "\"12333335552433\"";
              pcVar5 = "12333335552433";
              uVar4 = 0x248;
            }
          }
          else {
            pcVar3 = "\"FFFFFFFFFFFFFFFF00000000000000\"";
            pcVar5 = "FFFFFFFFFFFFFFFF00000000000000";
            uVar4 = 0x243;
          }
        }
        else {
          pcVar3 = "\"FFFF00000000000000\"";
          pcVar5 = "FFFF00000000000000";
          uVar4 = 0x23e;
        }
      }
      else {
        pcVar3 = "\"90000000\"";
        pcVar5 = "90000000";
        uVar4 = 0x239;
      }
    }
    else {
      pcVar3 = "\"A\"";
      pcVar5 = "A";
      uVar4 = 0x234;
    }
  }
  else {
    pcVar3 = "\"0\"";
    pcVar5 = "0";
    uVar4 = 0x22f;
  }
  printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %s\n#  Found:    %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/mmp[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-bignum.cc"
         ,uVar4,pcVar3,"buffer",pcVar5,&local_618);
  abort();
}

Assistant:

TEST(MultiplyUInt64) {
  char buffer[kBufferSize];
  Bignum bignum;

  AssignHexString(&bignum, "0");
  bignum.MultiplyByUInt64(0x25);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("0", buffer);

  AssignHexString(&bignum, "2");
  bignum.MultiplyByUInt64(0x5);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("A", buffer);

  AssignHexString(&bignum, "10000000");
  bignum.MultiplyByUInt64(0x9);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("90000000", buffer);

  AssignHexString(&bignum, "100000000000000");
  bignum.MultiplyByUInt64(0xFFFF);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("FFFF00000000000000", buffer);

  AssignHexString(&bignum, "100000000000000");
  bignum.MultiplyByUInt64(DOUBLE_CONVERSION_UINT64_2PART_C(0xFFFFFFFF, FFFFFFFF));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("FFFFFFFFFFFFFFFF00000000000000", buffer);

  AssignHexString(&bignum, "1234567ABCD");
  bignum.MultiplyByUInt64(0xFFF);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("12333335552433", buffer);

  AssignHexString(&bignum, "1234567ABCD");
  bignum.MultiplyByUInt64(DOUBLE_CONVERSION_UINT64_2PART_C(0xFF, FFFFFFFF));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1234567ABCBDCBA985433", buffer);

  AssignHexString(&bignum, "FFFFFFFFFFFFFFFF");
  bignum.MultiplyByUInt64(0x2);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1FFFFFFFFFFFFFFFE", buffer);

  AssignHexString(&bignum, "FFFFFFFFFFFFFFFF");
  bignum.MultiplyByUInt64(0x4);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("3FFFFFFFFFFFFFFFC", buffer);

  AssignHexString(&bignum, "FFFFFFFFFFFFFFFF");
  bignum.MultiplyByUInt64(0xF);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("EFFFFFFFFFFFFFFF1", buffer);

  AssignHexString(&bignum, "FFFFFFFFFFFFFFFF");
  bignum.MultiplyByUInt64(DOUBLE_CONVERSION_UINT64_2PART_C(0xFFFFFFFF, FFFFFFFF));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("FFFFFFFFFFFFFFFE0000000000000001", buffer);

  bignum.AssignUInt16(0x1);
  bignum.ShiftLeft(100);
  // "10 0000 0000 0000 0000 0000 0000"
  bignum.MultiplyByUInt64(2);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("20000000000000000000000000", buffer);

  bignum.AssignUInt16(0x1);
  bignum.ShiftLeft(100);
  // "10 0000 0000 0000 0000 0000 0000"
  bignum.MultiplyByUInt64(0xF);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("F0000000000000000000000000", buffer);

  bignum.AssignUInt16(0xFFFF);
  bignum.ShiftLeft(100);
  // "FFFF0 0000 0000 0000 0000 0000 0000"
  bignum.MultiplyByUInt64(0xFFFF);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("FFFE00010000000000000000000000000", buffer);

  bignum.AssignUInt16(0xFFFF);
  bignum.ShiftLeft(100);
  // "FFFF0 0000 0000 0000 0000 0000 0000"
  bignum.MultiplyByUInt64(0xFFFFFFFF);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("FFFEFFFF00010000000000000000000000000", buffer);

  bignum.AssignUInt16(0xFFFF);
  bignum.ShiftLeft(100);
  // "FFFF0 0000 0000 0000 0000 0000 0000"
  bignum.MultiplyByUInt64(DOUBLE_CONVERSION_UINT64_2PART_C(0xFFFFFFFF, FFFFFFFF));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("FFFEFFFFFFFFFFFF00010000000000000000000000000", buffer);

  AssignDecimalString(&bignum, "15611230384529777");
  bignum.MultiplyByUInt64(DOUBLE_CONVERSION_UINT64_2PART_C(0x8ac72304, 89e80000));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1E10EE4B11D15A7F3DE7F3C7680000", buffer);
}